

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnRight(OptimizeInstructions *this,Binary *curr)

{
  double __value;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_01;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_02;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_03;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_04;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_05;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_06;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_07;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_08;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_09;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  matcher_10;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  matcher_11;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_12;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_13;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_14;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_15;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_16;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_17;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_18;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_19;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_20;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  matcher_21;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_22;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_23;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_24;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_25;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_26;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_27;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_28;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_29;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_30;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_31;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_32;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_33;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_34;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_35;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_36;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_37;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_38;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_39;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  matcher_40;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
  matcher_41;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  matcher_42;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  matcher_43;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  matcher_44;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
  matcher_45;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
  matcher_46;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
  matcher_47;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
  matcher_48;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  matcher_49;
  Builder BVar1;
  bool bVar2;
  bool bVar3;
  Index IVar4;
  int iVar5;
  UnaryOp UVar6;
  BinaryOp BVar7;
  uint uVar8;
  BinaryOp BVar9;
  Module *pMVar10;
  int64_t iVar11;
  PassOptions *pPVar12;
  long x_00;
  undefined4 extraout_var;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *s;
  Expression **ppEVar13;
  BinaryOp *binder;
  OptimizeInstructions *pOVar14;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *in_R8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *s1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>
  *s2;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R9;
  bool local_21d9;
  bool local_21a9;
  bool local_2199;
  bool local_2189;
  bool local_2179;
  byte local_2161;
  bool local_2141;
  bool local_2131;
  bool local_2121;
  bool local_2111;
  bool local_20f9;
  bool local_20e1;
  bool local_20c9;
  bool local_20b1;
  bool local_2041;
  bool local_1f89;
  bool local_1f79;
  bool local_1f39;
  bool local_1f01;
  Literal local_1f00;
  Type local_1ee8;
  Literal local_1ee0;
  Type local_1ec8;
  Literal local_1ec0;
  uintptr_t local_1ea8;
  Type local_1ea0;
  uintptr_t local_1e98;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
  local_1e90;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_1e50;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  local_1e38;
  Expression *local_1e00;
  Expression *x_2;
  Binary *bin;
  Const *c_2;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1dc0 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
  local_1db0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>
  local_1d88;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1d60 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
  local_1d50;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>
  local_1d28;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1d00 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>_&>
  local_1cf0;
  uintptr_t local_1cc8;
  Literal local_1cc0;
  Literal local_1ca8;
  uintptr_t local_1c90;
  uintptr_t local_1c88;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>
  local_1c80;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1c38 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
  local_1c28;
  Literal local_1c00;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_1be8 [2];
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1ba8 [2];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_1b98;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  local_1b78;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_1b50 [2];
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1b10 [2];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_1b00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  local_1ae0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
  local_1ab8;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1a78 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&>
  local_1a68;
  double local_1a40;
  double value;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>
  local_1a30;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_19e8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>_&>
  local_19d8;
  undefined1 local_19b0 [8];
  Expression *x_1;
  Literal local_19a0;
  uintptr_t local_1988;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1980;
  undefined1 local_1938 [88];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_18e0;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_18b8;
  undefined1 local_1890 [8];
  Expression *x;
  uintptr_t local_1880;
  Literal local_1878;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1860;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1818 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_1808;
  uintptr_t local_17e0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_17d8;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1798 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_1788;
  uintptr_t local_1760;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_1758;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1718 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_1708;
  uintptr_t local_16e0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_16d8;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1698 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_1688;
  uintptr_t local_1660;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_1658;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1618 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_1608;
  Type local_15e0;
  Type local_15d8;
  Literal local_15d0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_15b8;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_1578;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_1560;
  Type local_1538;
  Type local_1530;
  Literal local_1528;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_1510;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_14d0;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_14b8;
  Type local_1490;
  Type local_1488;
  Literal local_1480;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_1468;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_1428;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_1410;
  Type local_13e8;
  Type local_13e0;
  Literal local_13d8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_13c0;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_1380;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_1368;
  Const *local_1340;
  Const *c_1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1330;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_12e8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_12d8;
  uintptr_t local_12b0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_12a8;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1260 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_1250;
  uintptr_t local_1228;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1220;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_11d8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_11c8;
  uintptr_t local_11a0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1198;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1150 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_1140;
  Type local_1118;
  Type local_1110;
  Literal local_1108;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_10f0;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_10a8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_1090;
  Type local_1068;
  Type local_1060;
  Literal local_1058;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1040;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_ff8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_fe8;
  Type local_fc0;
  Type local_fb8;
  Literal local_fb0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_f98;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_f50 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_f40;
  Type local_f18;
  Type local_f10;
  Literal local_f08;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_ef0;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_ea8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_e90;
  Type local_e68;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_e60;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_e18 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_e08;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
  local_de0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_da0 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  local_d90;
  uintptr_t local_d68;
  Literal local_d60;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_d48;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_d00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_ce8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_cc0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_c78 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_c68;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_c40;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_bf8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_be8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_bc0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_b78 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_b68;
  BasicType local_b3c;
  uintptr_t local_b38;
  OptimizeInstructions *local_b30;
  Unary *result;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_ae0 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_ad0;
  uintptr_t local_aa8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_aa0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_a58 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_a48;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_a20;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_9d8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_9c8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_9a0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_958 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_948;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_920;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_8d8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_8c8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
  local_8a0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_860 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  local_850;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
  local_828;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_7e8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  local_7d8;
  uintptr_t local_7b0;
  Literal local_7a8;
  Literal local_790;
  Literal local_778;
  uintptr_t local_760;
  Literal local_758;
  uintptr_t local_740;
  byte local_731;
  Literal local_730;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_718;
  undefined1 local_6d0 [64];
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_690 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_680;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_658;
  long local_630;
  Binary *inner_1;
  Const *c;
  Literal local_618;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_600;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_5b8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_5a0;
  uintptr_t local_578;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_570;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_528 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_518;
  Const *local_4f0;
  Const *zero;
  Literal local_4d8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_4c0;
  undefined1 local_480 [88];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_428;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_400;
  long local_3d8;
  Binary *inner;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_388;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_370;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_348;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_300;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_2e8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_2c0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_278 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_268;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_240;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1f8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_1e8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_1c0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_178 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_168;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_140;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_f8 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_e8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_c0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_78 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_68;
  Type local_40;
  Type type;
  Const *right;
  Expression *left;
  Builder builder;
  Binary *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm = (Module *)curr;
  pMVar10 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
            getModule(&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .
                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     );
  Builder::Builder((Builder *)&left,pMVar10);
  type.id = (uintptr_t)
            Expression::cast<wasm::Const>
                      ((Expression *)
                       ((builder.wasm)->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  BVar1 = builder;
  local_40.id = (uintptr_t)
                ((builder.wasm)->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[1]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  local_78[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right,
                           (Expression **)pMVar10);
  Match::ival(&local_c0,0);
  ppEVar13 = (Expression **)0xa;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_68,(Match *)0xa,(Op)local_78,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_c0,in_R8);
  matcher.data = local_68.data;
  matcher._12_4_ = local_68._12_4_;
  matcher.binder = local_68.binder;
  matcher.submatchers.curr = local_68.submatchers.curr;
  matcher.submatchers.next.curr = local_68.submatchers.next.curr;
  matcher.submatchers.next._8_8_ = local_68.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)BVar1.wasm,matcher);
  BVar1 = builder;
  local_1f01 = true;
  if (!bVar2) {
    local_f8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right,
                             ppEVar13);
    Match::ival(&local_140,0);
    ppEVar13 = (Expression **)0xb;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              (&local_e8,(Match *)0xb,(Op)local_f8,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_140,in_R8);
    matcher_00.data = local_e8.data;
    matcher_00._12_4_ = local_e8._12_4_;
    matcher_00.binder = local_e8.binder;
    matcher_00.submatchers.curr = local_e8.submatchers.curr;
    matcher_00.submatchers.next.curr = local_e8.submatchers.next.curr;
    matcher_00.submatchers.next._8_8_ = local_e8.submatchers.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                      ((Expression *)BVar1.wasm,matcher_00);
    BVar1 = builder;
    local_1f01 = true;
    if (!bVar2) {
      local_178[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                &right,ppEVar13);
      Match::ival(&local_1c0,0);
      ppEVar13 = (Expression **)0xc;
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                (&local_168,(Match *)0xc,(Op)local_178,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_1c0,in_R8);
      matcher_01.data = local_168.data;
      matcher_01._12_4_ = local_168._12_4_;
      matcher_01.binder = local_168.binder;
      matcher_01.submatchers.curr = local_168.submatchers.curr;
      matcher_01.submatchers.next.curr = local_168.submatchers.next.curr;
      matcher_01.submatchers.next._8_8_ = local_168.submatchers.next._8_8_;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                        ((Expression *)BVar1.wasm,matcher_01);
      BVar1 = builder;
      local_1f01 = true;
      if (!bVar2) {
        local_1f8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                  &right,ppEVar13);
        Match::ival(&local_240,0);
        ppEVar13 = (Expression **)0x10;
        Match::
        binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                  (&local_1e8,(Match *)0x10,(Op)local_1f8,
                   (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_240,in_R8)
        ;
        matcher_02.data = local_1e8.data;
        matcher_02._12_4_ = local_1e8._12_4_;
        matcher_02.binder = local_1e8.binder;
        matcher_02.submatchers.curr = local_1e8.submatchers.curr;
        matcher_02.submatchers.next.curr = local_1e8.submatchers.next.curr;
        matcher_02.submatchers.next._8_8_ = local_1e8.submatchers.next._8_8_;
        bVar2 = Match::
                matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                          ((Expression *)BVar1.wasm,matcher_02);
        BVar1 = builder;
        local_1f01 = true;
        if (!bVar2) {
          local_278[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                    &right,ppEVar13);
          Match::ival(&local_2c0,0);
          Match::
          binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                    (&local_268,(Match *)0x11,(Op)local_278,
                     (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_2c0,
                     in_R8);
          matcher_03.data = local_268.data;
          matcher_03._12_4_ = local_268._12_4_;
          matcher_03.binder = local_268.binder;
          matcher_03.submatchers.curr = local_268.submatchers.curr;
          matcher_03.submatchers.next.curr = local_268.submatchers.next.curr;
          matcher_03.submatchers.next._8_8_ = local_268.submatchers.next._8_8_;
          local_1f01 = Match::
                       matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                 ((Expression *)BVar1.wasm,matcher_03);
        }
      }
    }
  }
  BVar1.wasm = builder.wasm;
  if (local_1f01 != false) {
    return (Expression *)right;
  }
  pure(&local_300,this,(Expression **)&right);
  Match::ival(&local_348,0);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_2e8,(Match *)0x5,(Op)&local_300,
             (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)&local_348,in_R8);
  matcher_04.data = local_2e8.data;
  matcher_04._12_4_ = local_2e8._12_4_;
  matcher_04.binder = local_2e8.binder;
  matcher_04.submatchers.curr = local_2e8.submatchers.curr;
  matcher_04.submatchers.next.curr = local_2e8.submatchers.next.curr;
  matcher_04.submatchers.next._8_8_ = local_2e8.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_04);
  BVar1 = builder;
  local_1f39 = true;
  if (!bVar2) {
    pure(&local_388,this,(Expression **)&right);
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)&inner,0);
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              (&local_370,(Match *)0xf,(Op)&local_388,
               (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)&inner,in_R8);
    matcher_05.data = local_370.data;
    matcher_05._12_4_ = local_370._12_4_;
    matcher_05.binder = local_370.binder;
    matcher_05.submatchers.curr = local_370.submatchers.curr;
    matcher_05.submatchers.next.curr = local_370.submatchers.next.curr;
    matcher_05.submatchers.next._8_8_ = local_370.submatchers.next._8_8_;
    local_1f39 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                           ((Expression *)BVar1.wasm,matcher_05);
  }
  BVar1.wasm = builder.wasm;
  if (local_1f39 != false) {
    return (Expression *)type.id;
  }
  ppEVar13 = (Expression **)0x0;
  Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)(local_480 + 0x10),0);
  local_480._0_8_ =
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right,ppEVar13);
  s1 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_480;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_428,(Match *)&local_3d8,(Binary **)0x4,(int)local_480 + Or,s1,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R9);
  Match::ival();
  ppEVar13 = (Expression **)0x5;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_400,(Match *)0x5,(Op)&local_428,&local_4c0,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
              *)s1);
  matcher_06.data = local_400.data;
  matcher_06._12_4_ = local_400._12_4_;
  matcher_06.binder = local_400.binder;
  matcher_06.submatchers.curr = local_400.submatchers.curr;
  matcher_06.submatchers.next.curr = local_400.submatchers.next.curr;
  matcher_06.submatchers.next._8_8_ = local_400.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_06);
  BVar1 = builder;
  if (bVar2) {
    pPVar12 = Pass::getPassOptions((Pass *)this);
    if (pPVar12->shrinkLevel == 0) {
      iVar11 = wasm::Literal::getInteger((Literal *)(type.id + 0x10));
      bVar2 = Bits::isPowerOf2<long>(iVar11);
      if (bVar2) {
        ((builder.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)right;
        local_4f0 = Expression::cast<wasm::Const>(*(Expression **)(local_3d8 + 0x18));
        pOVar14 = (OptimizeInstructions *)
                  Builder::makeBinary((Builder *)&left,*(BinaryOp *)(local_3d8 + 0x10),
                                      (Expression *)local_4f0,(Expression *)builder.wasm);
        return (Expression *)pOVar14;
      }
    }
    wasm::Literal::neg(&local_4d8,(Literal *)(type.id + 0x10));
    wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_4d8);
    wasm::Literal::~Literal(&local_4d8);
    ((builder.wasm)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)right;
    return (Expression *)builder.wasm;
  }
  local_528[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right,
                            ppEVar13);
  Match::ival(&local_570,0);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_518,(Match *)0x14,(Op)local_528,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_570,s1);
  matcher_07.data = local_518.data;
  matcher_07._12_4_ = local_518._12_4_;
  matcher_07.binder = local_518.binder;
  matcher_07.submatchers.curr = local_518.submatchers.curr;
  matcher_07.submatchers.next.curr = local_518.submatchers.next.curr;
  matcher_07.submatchers.next._8_8_ = local_518.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_07);
  BVar1 = builder;
  if (bVar2) {
    local_578 = local_40.id;
    UVar6 = Abstract::getUnary(local_40,EqZ);
    pOVar14 = (OptimizeInstructions *)Builder::makeUnary((Builder *)&left,UVar6,(Expression *)right)
    ;
    return (Expression *)pOVar14;
  }
  pure(&local_5b8,this,(Expression **)&right);
  Match::ival(&local_600,1);
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_5a0,(Match *)0x9,(Op)&local_5b8,
             (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)&local_600,s1);
  matcher_08.data = local_5a0.data;
  matcher_08._12_4_ = local_5a0._12_4_;
  matcher_08.binder = local_5a0.binder;
  matcher_08.submatchers.curr = local_5a0.submatchers.curr;
  matcher_08.submatchers.next.curr = local_5a0.submatchers.next.curr;
  matcher_08.submatchers.next._8_8_ = local_5a0.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_08);
  BVar1 = builder;
  if (bVar2) {
    c = (Const *)local_40.id;
    wasm::Literal::makeZero(&local_618,local_40);
    wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_618);
    wasm::Literal::~Literal(&local_618);
    return (Expression *)type.id;
  }
  local_690[0] = Match::any();
  Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
               *)local_6d0,(Const **)&inner_1);
  s2 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>_>
        *)local_6d0;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_680,(Match *)&local_630,(Binary **)0x9,(Op)local_690,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)s2,in_R9);
  Match::ival(&local_718,0);
  binder = (BinaryOp *)0x15;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_658,(Match *)0x15,(Op)&local_680,
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&local_718,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)s2);
  matcher_09.data = local_658.data;
  matcher_09._12_4_ = local_658._12_4_;
  matcher_09.binder = local_658.binder;
  matcher_09.submatchers.curr = local_658.submatchers.curr;
  matcher_09.submatchers.next.curr = local_658.submatchers.next.curr;
  matcher_09.submatchers.next._8_8_ = local_658.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_09);
  local_731 = 0;
  local_1f79 = false;
  if (bVar2) {
    bVar2 = wasm::Literal::isSignedMin((Literal *)&inner_1->op);
    local_1f89 = true;
    if (!bVar2) {
      binder = &inner_1->op;
      wasm::Literal::abs(&local_730,(int)binder);
      local_731 = 1;
      iVar11 = wasm::Literal::getInteger(&local_730);
      local_1f89 = Bits::isPowerOf2<long>(iVar11);
    }
    local_1f79 = local_1f89;
  }
  if ((local_731 & 1) != 0) {
    wasm::Literal::~Literal(&local_730);
  }
  BVar1.wasm = builder.wasm;
  if (local_1f79 != false) {
    local_740 = (inner_1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.
                id;
    BVar7 = Abstract::getBinary((Type)local_740,And);
    *(BinaryOp *)(local_630 + 0x10) = BVar7;
    bVar2 = wasm::Literal::isSignedMin((Literal *)&inner_1->op);
    if (bVar2) {
      local_760 = (inner_1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                  type.id;
      wasm::Literal::makeSignedMax(&local_758,(Type)local_760);
      wasm::Literal::operator=((Literal *)&inner_1->op,&local_758);
      wasm::Literal::~Literal(&local_758);
    }
    else {
      wasm::Literal::abs(&local_790,(int)inner_1 + 0x10);
      local_7b0 = (inner_1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                  type.id;
      wasm::Literal::makeOne(&local_7a8,(Type)local_7b0);
      wasm::Literal::sub(&local_778,&local_790,&local_7a8);
      wasm::Literal::operator=((Literal *)&inner_1->op,&local_778);
      wasm::Literal::~Literal(&local_778);
      wasm::Literal::~Literal(&local_7a8);
      wasm::Literal::~Literal(&local_790);
    }
    return (Expression *)builder.wasm;
  }
  local_7e8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right,
                            (Expression **)binder);
  Match::i32(&local_828,1);
  ppEVar13 = (Expression **)0xf;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>>
            (&local_7d8,(Match *)0xf,(BinaryOp)local_7e8,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_828,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)s2);
  matcher_10.data = local_7d8.data;
  matcher_10._12_4_ = local_7d8._12_4_;
  matcher_10.binder = local_7d8.binder;
  matcher_10.submatchers.curr = local_7d8.submatchers.curr;
  matcher_10.submatchers.next.curr = local_7d8.submatchers.next.curr;
  matcher_10.submatchers.next._8_8_ = local_7d8.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_10);
  BVar1 = builder;
  if (bVar2) {
LAB_01f859aa:
    pOVar14 = this;
    IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)right,this);
    bVar2 = IVar4 == 1;
  }
  else {
    local_860[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right
                              ,ppEVar13);
    Match::i32(&local_8a0,0);
    ppEVar13 = (Expression **)0x10;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>>
              (&local_850,(Match *)0x10,(BinaryOp)local_860,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_8a0,
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                *)s2);
    matcher_11.data = local_850.data;
    matcher_11._12_4_ = local_850._12_4_;
    matcher_11.binder = local_850.binder;
    matcher_11.submatchers.curr = local_850.submatchers.curr;
    matcher_11.submatchers.next.curr = local_850.submatchers.next.curr;
    matcher_11.submatchers.next._8_8_ = local_850.submatchers.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                      ((Expression *)BVar1.wasm,matcher_11);
    BVar1 = builder;
    if (bVar2) goto LAB_01f859aa;
    local_8d8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right
                              ,ppEVar13);
    Match::ival(&local_920,1);
    pOVar14 = (OptimizeInstructions *)0xf;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              (&local_8c8,(Match *)0xf,(Op)local_8d8,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_920,
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)s2);
    matcher_12.data = local_8c8.data;
    matcher_12._12_4_ = local_8c8._12_4_;
    matcher_12.binder = local_8c8.binder;
    matcher_12.submatchers.curr = local_8c8.submatchers.curr;
    matcher_12.submatchers.next.curr = local_8c8.submatchers.next.curr;
    matcher_12.submatchers.next._8_8_ = local_8c8.submatchers.next._8_8_;
    bVar3 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                      ((Expression *)BVar1.wasm,matcher_12);
    bVar2 = false;
    if (bVar3) goto LAB_01f859aa;
  }
  BVar1.wasm = builder.wasm;
  if (bVar2) {
    return (Expression *)right;
  }
  local_958[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right,
                            (Expression **)pOVar14);
  Match::i64(&local_9a0,1);
  ppEVar13 = (Expression **)0x28;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            (&local_948,(Match *)0x28,(BinaryOp)local_958,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_9a0,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)s2);
  matcher_13.data = local_948.data;
  matcher_13._12_4_ = local_948._12_4_;
  matcher_13.binder = local_948.binder;
  matcher_13.submatchers.curr = local_948.submatchers.curr;
  matcher_13.submatchers.next.curr = local_948.submatchers.next.curr;
  matcher_13.submatchers.next._8_8_ = local_948.submatchers.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_13);
  BVar1 = builder;
  if (!bVar2) {
    local_9d8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right
                              ,ppEVar13);
    Match::i64(&local_a20,0);
    pOVar14 = (OptimizeInstructions *)0x29;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              (&local_9c8,(Match *)0x29,(BinaryOp)local_9d8,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_a20,
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)s2);
    matcher_14.data = local_9c8.data;
    matcher_14._12_4_ = local_9c8._12_4_;
    matcher_14.binder = local_9c8.binder;
    matcher_14.submatchers.curr = local_9c8.submatchers.curr;
    matcher_14.submatchers.next.curr = local_9c8.submatchers.next.curr;
    matcher_14.submatchers.next._8_8_ = local_9c8.submatchers.next._8_8_;
    bVar3 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                      ((Expression *)BVar1.wasm,matcher_14);
    bVar2 = false;
    if (!bVar3) goto LAB_01f85b05;
  }
  pOVar14 = this;
  IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)right,this);
  bVar2 = IVar4 == 1;
LAB_01f85b05:
  BVar1.wasm = builder.wasm;
  if (bVar2) {
    this_local = (OptimizeInstructions *)
                 Builder::makeUnary((Builder *)&left,WrapInt64,(Expression *)right);
  }
  else {
    local_a58[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&right
                              ,(Expression **)pOVar14);
    Match::ival(&local_aa0,1);
    pOVar14 = (OptimizeInstructions *)0x15;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              (&local_a48,(Match *)0x15,(Op)local_a58,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_aa0,
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)s2);
    matcher_15.data = local_a48.data;
    matcher_15._12_4_ = local_a48._12_4_;
    matcher_15.binder = local_a48.binder;
    matcher_15.submatchers.curr = local_a48.submatchers.curr;
    matcher_15.submatchers.next.curr = local_a48.submatchers.next.curr;
    matcher_15.submatchers.next._8_8_ = local_a48.submatchers.next._8_8_;
    bVar3 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                      ((Expression *)BVar1.wasm,matcher_15);
    bVar2 = false;
    if (bVar3) {
      pOVar14 = this;
      IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)right,this);
      bVar2 = IVar4 == 1;
    }
    BVar1.wasm = builder.wasm;
    if (bVar2) {
      local_aa8 = local_40.id;
      UVar6 = Abstract::getUnary(local_40,EqZ);
      this_local = (OptimizeInstructions *)
                   Builder::makeUnary((Builder *)&left,UVar6,(Expression *)right);
    }
    else {
      local_ae0[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                &right,(Expression **)pOVar14);
      Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                   *)&result,1);
      pOVar14 = (OptimizeInstructions *)0x11;
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                (&local_ad0,(Match *)0x11,(Op)local_ae0,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&result,
                 (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                  *)s2);
      matcher_16.data = local_ad0.data;
      matcher_16._12_4_ = local_ad0._12_4_;
      matcher_16.binder = local_ad0.binder;
      matcher_16.submatchers.curr = local_ad0.submatchers.curr;
      matcher_16.submatchers.next.curr = local_ad0.submatchers.next.curr;
      matcher_16.submatchers.next._8_8_ = local_ad0.submatchers.next._8_8_;
      bVar3 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                        ((Expression *)BVar1.wasm,matcher_16);
      bVar2 = false;
      if (bVar3) {
        pOVar14 = this;
        IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)right,this);
        bVar2 = IVar4 == 1;
      }
      BVar1.wasm = builder.wasm;
      if (bVar2) {
        local_b38 = local_40.id;
        UVar6 = Abstract::getUnary(local_40,EqZ);
        local_b30 = (OptimizeInstructions *)
                    Builder::makeUnary((Builder *)&left,UVar6,(Expression *)right);
        local_b3c = i64;
        bVar2 = wasm::Type::operator==
                          (&(right->super_SpecificExpression<(wasm::Expression::Id)14>).
                            super_Expression.type,&local_b3c);
        if (bVar2) {
          local_b30 = (OptimizeInstructions *)
                      Builder::makeUnary((Builder *)&left,ExtendUInt32,(Expression *)local_b30);
        }
        this_local = local_b30;
      }
      else {
        local_b78[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                  &right,(Expression **)pOVar14);
        Match::ival(&local_bc0,1);
        pOVar14 = (OptimizeInstructions *)0x10;
        Match::
        binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                  (&local_b68,(Match *)0x10,(Op)local_b78,
                   (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_bc0,
                   (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                    *)s2);
        matcher_17.data = local_b68.data;
        matcher_17._12_4_ = local_b68._12_4_;
        matcher_17.binder = local_b68.binder;
        matcher_17.submatchers.curr = local_b68.submatchers.curr;
        matcher_17.submatchers.next.curr = local_b68.submatchers.next.curr;
        matcher_17.submatchers.next._8_8_ = local_b68.submatchers.next._8_8_;
        bVar3 = Match::
                matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                          ((Expression *)BVar1.wasm,matcher_17);
        bVar2 = false;
        if (bVar3) {
          pOVar14 = this;
          IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)right,this);
          bVar2 = IVar4 == 1;
        }
        BVar1.wasm = builder.wasm;
        if (bVar2) {
          this_local = (OptimizeInstructions *)
                       getDroppedChildrenAndAppend
                                 (this,(Expression *)builder.wasm,(Expression *)type.id);
        }
        else {
          local_bf8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                    &right,(Expression **)pOVar14);
          Match::ival(&local_c40,-1);
          ppEVar13 = (Expression **)0xf;
          Match::
          binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                    (&local_be8,(Match *)0xf,(Op)local_bf8,
                     (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_c40,
                     (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                      *)s2);
          matcher_18.data = local_be8.data;
          matcher_18._12_4_ = local_be8._12_4_;
          matcher_18.binder = local_be8.binder;
          matcher_18.submatchers.curr = local_be8.submatchers.curr;
          matcher_18.submatchers.next.curr = local_be8.submatchers.next.curr;
          matcher_18.submatchers.next._8_8_ = local_be8.submatchers.next._8_8_;
          bVar2 = Match::
                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                            ((Expression *)BVar1.wasm,matcher_18);
          BVar1 = builder;
          if (bVar2) {
            this_local = (OptimizeInstructions *)right;
          }
          else {
            local_c78[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                       *)&right,ppEVar13);
            Match::ival(&local_cc0,-1);
            Match::
            binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                      (&local_c68,(Match *)0x10,(Op)local_c78,
                       (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_cc0,
                       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                        *)s2);
            matcher_19.data = local_c68.data;
            matcher_19._12_4_ = local_c68._12_4_;
            matcher_19.binder = local_c68.binder;
            matcher_19.submatchers.curr = local_c68.submatchers.curr;
            matcher_19.submatchers.next.curr = local_c68.submatchers.next.curr;
            matcher_19.submatchers.next._8_8_ = local_c68.submatchers.next._8_8_;
            bVar2 = Match::
                    matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                              ((Expression *)BVar1.wasm,matcher_19);
            BVar1 = builder;
            if (bVar2) {
              this_local = (OptimizeInstructions *)
                           getDroppedChildrenAndAppend
                                     (this,(Expression *)builder.wasm,(Expression *)type.id);
            }
            else {
              pure(&local_d00,this,(Expression **)&right);
              Match::ival(&local_d48,-1);
              Match::
              binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                        (&local_ce8,(Match *)0x9,(Op)&local_d00,
                         (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)&local_d48,
                         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                          *)s2);
              matcher_20.data = local_ce8.data;
              matcher_20._12_4_ = local_ce8._12_4_;
              matcher_20.binder = local_ce8.binder;
              matcher_20.submatchers.curr = local_ce8.submatchers.curr;
              matcher_20.submatchers.next.curr = local_ce8.submatchers.next.curr;
              matcher_20.submatchers.next._8_8_ = local_ce8.submatchers.next._8_8_;
              bVar2 = Match::
                      matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                ((Expression *)BVar1.wasm,matcher_20);
              BVar1 = builder;
              if (bVar2) {
                local_d68 = local_40.id;
                wasm::Literal::makeZero(&local_d60,local_40);
                wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_d60);
                wasm::Literal::~Literal(&local_d60);
                this_local = (OptimizeInstructions *)type.id;
              }
              else {
                local_da0[0] = Match::any();
                iVar5 = std::numeric_limits<int>::min();
                Match::i32(&local_de0,iVar5);
                Match::
                binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>>
                          (&local_d90,(Match *)0x3,(BinaryOp)local_da0,
                           (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                           &local_de0,
                           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                            *)s2);
                matcher_21.data = local_d90.data;
                matcher_21._12_4_ = local_d90._12_4_;
                matcher_21.binder = local_d90.binder;
                matcher_21.submatchers.curr = local_d90.submatchers.curr;
                matcher_21.submatchers.next.curr = local_d90.submatchers.next.curr;
                matcher_21.submatchers.next._8_8_ = local_d90.submatchers.next._8_8_;
                bVar2 = Match::
                        matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                                  ((Expression *)BVar1.wasm,matcher_21);
                if (bVar2) {
                  *(undefined4 *)
                   &((builder.wasm)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0xf;
                  this_local = (OptimizeInstructions *)builder.wasm;
                }
                else {
                  pPVar12 = Pass::getPassOptions((Pass *)this);
                  BVar1 = builder;
                  local_2041 = false;
                  if (pPVar12->shrinkLevel == 0) {
                    local_e18[0] = Match::any();
                    x_00 = std::numeric_limits<long>::min();
                    Match::i64(&local_e60,x_00);
                    Match::
                    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                              (&local_e08,(Match *)0x1c,(BinaryOp)local_e18,
                               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                               &local_e60,
                               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                *)s2);
                    matcher_22.data = local_e08.data;
                    matcher_22._12_4_ = local_e08._12_4_;
                    matcher_22.binder = local_e08.binder;
                    matcher_22.submatchers.curr = local_e08.submatchers.curr;
                    matcher_22.submatchers.next.curr = local_e08.submatchers.next.curr;
                    matcher_22.submatchers.next._8_8_ = local_e08.submatchers.next._8_8_;
                    local_2041 = Match::
                                 matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                           ((Expression *)BVar1.wasm,matcher_22);
                  }
                  BVar1.wasm = builder.wasm;
                  if (local_2041 == false) {
                    pure(&local_ea8,this,(Expression **)&right);
                    Match::ival(&local_ef0,0);
                    ppEVar13 = (Expression **)0x17;
                    Match::
                    binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                              (&local_e90,(Match *)0x17,(Op)&local_ea8,
                               (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)
                               &local_ef0,
                               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                *)s2);
                    matcher_23.data = local_e90.data;
                    matcher_23._12_4_ = local_e90._12_4_;
                    matcher_23.binder = local_e90.binder;
                    matcher_23.submatchers.curr = local_e90.submatchers.curr;
                    matcher_23.submatchers.next.curr = local_e90.submatchers.next.curr;
                    matcher_23.submatchers.next._8_8_ = local_e90.submatchers.next._8_8_;
                    bVar2 = Match::
                            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                      ((Expression *)BVar1.wasm,matcher_23);
                    BVar1 = builder;
                    if (bVar2) {
                      wasm::Type::Type(&local_f10,i32);
                      wasm::Literal::makeZero(&local_f08,local_f10);
                      wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_f08);
                      wasm::Literal::~Literal(&local_f08);
                      wasm::Type::Type(&local_f18,i32);
                      *(uintptr_t *)(type.id + 8) = local_f18.id;
                      this_local = (OptimizeInstructions *)type.id;
                    }
                    else {
                      local_f50[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                 *)&right,ppEVar13);
                      Match::ival(&local_f98,-1);
                      ppEVar13 = (Expression **)0x19;
                      Match::
                      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                (&local_f40,(Match *)0x19,(Op)local_f50,
                                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                 &local_f98,
                                 (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                  *)s2);
                      matcher_24.data = local_f40.data;
                      matcher_24._12_4_ = local_f40._12_4_;
                      matcher_24.binder = local_f40.binder;
                      matcher_24.submatchers.curr = local_f40.submatchers.curr;
                      matcher_24.submatchers.next.curr = local_f40.submatchers.next.curr;
                      matcher_24.submatchers.next._8_8_ = local_f40.submatchers.next._8_8_;
                      bVar2 = Match::
                              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                        ((Expression *)BVar1.wasm,matcher_24);
                      BVar1 = builder;
                      if (bVar2) {
                        wasm::Type::Type(&local_fb8,i32);
                        wasm::Literal::makeOne(&local_fb0,local_fb8);
                        wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_fb0);
                        wasm::Literal::~Literal(&local_fb0);
                        wasm::Type::Type(&local_fc0,i32);
                        *(uintptr_t *)(type.id + 8) = local_fc0.id;
                        this_local = (OptimizeInstructions *)
                                     getDroppedChildrenAndAppend
                                               (this,(Expression *)builder.wasm,
                                                (Expression *)type.id);
                      }
                      else {
                        local_ff8[0] = Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&right,ppEVar13);
                        Match::ival(&local_1040,-1);
                        Match::
                        binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                  (&local_fe8,(Match *)0x1b,(Op)local_ff8,
                                   (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                   &local_1040,
                                   (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                    *)s2);
                        matcher_25.data = local_fe8.data;
                        matcher_25._12_4_ = local_fe8._12_4_;
                        matcher_25.binder = local_fe8.binder;
                        matcher_25.submatchers.curr = local_fe8.submatchers.curr;
                        matcher_25.submatchers.next.curr = local_fe8.submatchers.next.curr;
                        matcher_25.submatchers.next._8_8_ = local_fe8.submatchers.next._8_8_;
                        bVar2 = Match::
                                matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                          ((Expression *)BVar1.wasm,matcher_25);
                        BVar1 = builder;
                        if (bVar2) {
                          wasm::Type::Type(&local_1060,i32);
                          wasm::Literal::makeZero(&local_1058,local_1060);
                          wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_1058);
                          wasm::Literal::~Literal(&local_1058);
                          wasm::Type::Type(&local_1068,i32);
                          *(uintptr_t *)(type.id + 8) = local_1068.id;
                          this_local = (OptimizeInstructions *)
                                       getDroppedChildrenAndAppend
                                                 (this,(Expression *)builder.wasm,
                                                  (Expression *)type.id);
                        }
                        else {
                          pure(&local_10a8,this,(Expression **)&right);
                          Match::ival(&local_10f0,0);
                          Match::
                          binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                    (&local_1090,(Match *)0x1d,(Op)&local_10a8,
                                     (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)
                                     &local_10f0,
                                     (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                      *)s2);
                          matcher_26.data = local_1090.data;
                          matcher_26._12_4_ = local_1090._12_4_;
                          matcher_26.binder = local_1090.binder;
                          matcher_26.submatchers.curr = local_1090.submatchers.curr;
                          matcher_26.submatchers.next.curr = local_1090.submatchers.next.curr;
                          matcher_26.submatchers.next._8_8_ = local_1090.submatchers.next._8_8_;
                          bVar2 = Match::
                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                            ((Expression *)BVar1.wasm,matcher_26);
                          BVar1 = builder;
                          if (bVar2) {
                            wasm::Type::Type(&local_1110,i32);
                            wasm::Literal::makeOne(&local_1108,local_1110);
                            wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_1108);
                            wasm::Literal::~Literal(&local_1108);
                            wasm::Type::Type(&local_1118,i32);
                            *(uintptr_t *)(type.id + 8) = local_1118.id;
                            this_local = (OptimizeInstructions *)type.id;
                          }
                          else {
                            local_1150[0] = Match::any();
                            Match::ival(&local_1198,-1);
                            Match::
                            binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                      (&local_1140,(Match *)0x17,(Op)local_1150,
                                       (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                        *)&local_1198,
                                       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                        *)s2);
                            matcher_27.data = local_1140.data;
                            matcher_27._12_4_ = local_1140._12_4_;
                            matcher_27.binder = local_1140.binder;
                            matcher_27.submatchers.curr = local_1140.submatchers.curr;
                            matcher_27.submatchers.next.curr = local_1140.submatchers.next.curr;
                            matcher_27.submatchers.next._8_8_ = local_1140.submatchers.next._8_8_;
                            bVar2 = Match::
                                    matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                              ((Expression *)BVar1.wasm,matcher_27);
                            BVar1 = builder;
                            if (bVar2) {
                              local_11a0 = local_40.id;
                              BVar7 = Abstract::getBinary(local_40,Ne);
                              *(BinaryOp *)
                               &((builder.wasm)->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage = BVar7;
                              this_local = (OptimizeInstructions *)builder.wasm;
                            }
                            else {
                              local_11d8[0] = Match::any();
                              Match::ival(&local_1220,0);
                              Match::
                              binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                        (&local_11c8,(Match *)0x19,(Op)local_11d8,
                                         (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                          *)&local_1220,
                                         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                          *)s2);
                              matcher_28.data = local_11c8.data;
                              matcher_28._12_4_ = local_11c8._12_4_;
                              matcher_28.binder = local_11c8.binder;
                              matcher_28.submatchers.curr = local_11c8.submatchers.curr;
                              matcher_28.submatchers.next.curr = local_11c8.submatchers.next.curr;
                              matcher_28.submatchers.next._8_8_ = local_11c8.submatchers.next._8_8_;
                              bVar2 = Match::
                                      matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                                ((Expression *)BVar1.wasm,matcher_28);
                              BVar1 = builder;
                              if (bVar2) {
                                local_1228 = local_40.id;
                                BVar7 = Abstract::getBinary(local_40,Eq);
                                *(BinaryOp *)
                                 &((builder.wasm)->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage = BVar7;
                                this_local = (OptimizeInstructions *)builder.wasm;
                              }
                              else {
                                local_1260[0] = Match::any();
                                Match::ival(&local_12a8,0);
                                Match::
                                binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                          (&local_1250,(Match *)0x1b,(Op)local_1260,
                                           (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                            *)&local_12a8,
                                           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                            *)s2);
                                matcher_29.data = local_1250.data;
                                matcher_29._12_4_ = local_1250._12_4_;
                                matcher_29.binder = local_1250.binder;
                                matcher_29.submatchers.curr = local_1250.submatchers.curr;
                                matcher_29.submatchers.next.curr = local_1250.submatchers.next.curr;
                                matcher_29.submatchers.next._8_8_ =
                                     local_1250.submatchers.next._8_8_;
                                bVar2 = Match::
                                        matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                                  ((Expression *)BVar1.wasm,matcher_29);
                                BVar1 = builder;
                                if (bVar2) {
                                  local_12b0 = local_40.id;
                                  BVar7 = Abstract::getBinary(local_40,Ne);
                                  *(BinaryOp *)
                                   &((builder.wasm)->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage = BVar7;
                                  this_local = (OptimizeInstructions *)builder.wasm;
                                }
                                else {
                                  local_12e8[0] = Match::any();
                                  Match::ival(&local_1330,-1);
                                  Match::
                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                            (&local_12d8,(Match *)0x1d,(Op)local_12e8,
                                             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                              *)&local_1330,
                                             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                              *)s2);
                                  matcher_30.data = local_12d8.data;
                                  matcher_30._12_4_ = local_12d8._12_4_;
                                  matcher_30.binder = local_12d8.binder;
                                  matcher_30.submatchers.curr = local_12d8.submatchers.curr;
                                  matcher_30.submatchers.next.curr =
                                       local_12d8.submatchers.next.curr;
                                  matcher_30.submatchers.next._8_8_ =
                                       local_12d8.submatchers.next._8_8_;
                                  bVar2 = Match::
                                          matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                                    ((Expression *)BVar1.wasm,matcher_30);
                                  BVar1 = builder;
                                  if (bVar2) {
                                    c_1 = (Const *)local_40.id;
                                    BVar7 = Abstract::getBinary(local_40,Eq);
                                    *(BinaryOp *)
                                     &((builder.wasm)->exports).
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage = BVar7;
                                    this_local = (OptimizeInstructions *)builder.wasm;
                                  }
                                  else {
                                    pure(&local_1380,this,(Expression **)&right);
                                    Match::ival(&local_13c0,&local_1340);
                                    Match::
                                    binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                              (&local_1368,(Match *)0x16,(Op)&local_1380,
                                               (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>
                                                *)&local_13c0,
                                               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                *)s2);
                                    matcher_31.data = local_1368.data;
                                    matcher_31._12_4_ = local_1368._12_4_;
                                    matcher_31.binder = local_1368.binder;
                                    matcher_31.submatchers.curr = local_1368.submatchers.curr;
                                    matcher_31.submatchers.next.curr =
                                         local_1368.submatchers.next.curr;
                                    matcher_31.submatchers.next._8_8_ =
                                         local_1368.submatchers.next._8_8_;
                                    bVar2 = Match::
                                            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                      ((Expression *)BVar1.wasm,matcher_31);
                                    local_20b1 = false;
                                    if (bVar2) {
                                      local_20b1 = wasm::Literal::isSignedMin(&local_1340->value);
                                    }
                                    BVar1.wasm = builder.wasm;
                                    if (local_20b1 == false) {
                                      pure(&local_1428,this,(Expression **)&right);
                                      Match::ival(&local_1468,&local_1340);
                                      Match::
                                      binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                                (&local_1410,(Match *)0x18,(Op)&local_1428,
                                                 (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>
                                                  *)&local_1468,
                                                 (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                  *)s2);
                                      matcher_32.data = local_1410.data;
                                      matcher_32._12_4_ = local_1410._12_4_;
                                      matcher_32.binder = local_1410.binder;
                                      matcher_32.submatchers.curr = local_1410.submatchers.curr;
                                      matcher_32.submatchers.next.curr =
                                           local_1410.submatchers.next.curr;
                                      matcher_32.submatchers.next._8_8_ =
                                           local_1410.submatchers.next._8_8_;
                                      bVar2 = Match::
                                              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                        ((Expression *)BVar1.wasm,matcher_32);
                                      local_20c9 = false;
                                      if (bVar2) {
                                        local_20c9 = wasm::Literal::isSignedMax(&local_1340->value);
                                      }
                                      BVar1.wasm = builder.wasm;
                                      if (local_20c9 == false) {
                                        pure(&local_14d0,this,(Expression **)&right);
                                        Match::ival(&local_1510,&local_1340);
                                        Match::
                                        binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                                  (&local_14b8,(Match *)0x1a,(Op)&local_14d0,
                                                   (
                                                  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>
                                                  *)&local_1510,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                  *)s2);
                                        matcher_33.data = local_14b8.data;
                                        matcher_33._12_4_ = local_14b8._12_4_;
                                        matcher_33.binder = local_14b8.binder;
                                        matcher_33.submatchers.curr = local_14b8.submatchers.curr;
                                        matcher_33.submatchers.next.curr =
                                             local_14b8.submatchers.next.curr;
                                        matcher_33.submatchers.next._8_8_ =
                                             local_14b8.submatchers.next._8_8_;
                                        bVar2 = Match::
                                                matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                          ((Expression *)BVar1.wasm,matcher_33);
                                        local_20e1 = false;
                                        if (bVar2) {
                                          local_20e1 = wasm::Literal::isSignedMax
                                                                 (&local_1340->value);
                                        }
                                        BVar1.wasm = builder.wasm;
                                        if (local_20e1 == false) {
                                          pure(&local_1578,this,(Expression **)&right);
                                          Match::ival(&local_15b8,&local_1340);
                                          Match::
                                          binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                                    (&local_1560,(Match *)0x1c,(Op)&local_1578,
                                                     (
                                                  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>
                                                  *)&local_15b8,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                  *)s2);
                                          matcher_34.data = local_1560.data;
                                          matcher_34._12_4_ = local_1560._12_4_;
                                          matcher_34.binder = local_1560.binder;
                                          matcher_34.submatchers.curr = local_1560.submatchers.curr;
                                          matcher_34.submatchers.next.curr =
                                               local_1560.submatchers.next.curr;
                                          matcher_34.submatchers.next._8_8_ =
                                               local_1560.submatchers.next._8_8_;
                                          bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_34);
                                          local_20f9 = false;
                                          if (bVar2) {
                                            local_20f9 = wasm::Literal::isSignedMin
                                                                   (&local_1340->value);
                                          }
                                          BVar1.wasm = builder.wasm;
                                          if (local_20f9 == false) {
                                            local_1618[0] = Match::any();
                                            Match::ival(&local_1658,&local_1340);
                                            Match::
                                            binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                                      (&local_1608,(Match *)0x16,(Op)local_1618,
                                                       (
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1658,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                  *)s2);
                                            matcher_35.data = local_1608.data;
                                            matcher_35._12_4_ = local_1608._12_4_;
                                            matcher_35.binder = local_1608.binder;
                                            matcher_35.submatchers.curr =
                                                 local_1608.submatchers.curr;
                                            matcher_35.submatchers.next.curr =
                                                 local_1608.submatchers.next.curr;
                                            matcher_35.submatchers.next._8_8_ =
                                                 local_1608.submatchers.next._8_8_;
                                            bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_35);
                                            local_2111 = false;
                                            if (bVar2) {
                                              local_2111 = wasm::Literal::isSignedMax
                                                                     (&local_1340->value);
                                            }
                                            BVar1.wasm = builder.wasm;
                                            if (local_2111 == false) {
                                              local_1698[0] = Match::any();
                                              Match::ival(&local_16d8,&local_1340);
                                              Match::
                                              binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                                        (&local_1688,(Match *)0x18,(Op)local_1698,
                                                         (
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_16d8,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                  *)s2);
                                              matcher_36.data = local_1688.data;
                                              matcher_36._12_4_ = local_1688._12_4_;
                                              matcher_36.binder = local_1688.binder;
                                              matcher_36.submatchers.curr =
                                                   local_1688.submatchers.curr;
                                              matcher_36.submatchers.next.curr =
                                                   local_1688.submatchers.next.curr;
                                              matcher_36.submatchers.next._8_8_ =
                                                   local_1688.submatchers.next._8_8_;
                                              bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_36);
                                              local_2121 = false;
                                              if (bVar2) {
                                                local_2121 = wasm::Literal::isSignedMin
                                                                       (&local_1340->value);
                                              }
                                              BVar1.wasm = builder.wasm;
                                              if (local_2121 == false) {
                                                local_1718[0] = Match::any();
                                                Match::ival(&local_1758,&local_1340);
                                                Match::
                                                binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                                          (&local_1708,(Match *)0x1a,(Op)local_1718,
                                                           (
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1758,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                  *)s2);
                                                matcher_37.data = local_1708.data;
                                                matcher_37._12_4_ = local_1708._12_4_;
                                                matcher_37.binder = local_1708.binder;
                                                matcher_37.submatchers.curr =
                                                     local_1708.submatchers.curr;
                                                matcher_37.submatchers.next.curr =
                                                     local_1708.submatchers.next.curr;
                                                matcher_37.submatchers.next._8_8_ =
                                                     local_1708.submatchers.next._8_8_;
                                                bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_37);
                                                local_2131 = false;
                                                if (bVar2) {
                                                  local_2131 = wasm::Literal::isSignedMin
                                                                         (&local_1340->value);
                                                }
                                                BVar1.wasm = builder.wasm;
                                                if (local_2131 == false) {
                                                  local_1798[0] = Match::any();
                                                  Match::ival(&local_17d8,&local_1340);
                                                  ppEVar13 = (Expression **)0x1c;
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                                                            (&local_1788,(Match *)0x1c,
                                                             (Op)local_1798,
                                                             (
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_17d8,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                                                  *)s2);
                                                  matcher_38.data = local_1788.data;
                                                  matcher_38._12_4_ = local_1788._12_4_;
                                                  matcher_38.binder = local_1788.binder;
                                                  matcher_38.submatchers.curr =
                                                       local_1788.submatchers.curr;
                                                  matcher_38.submatchers.next.curr =
                                                       local_1788.submatchers.next.curr;
                                                  matcher_38.submatchers.next._8_8_ =
                                                       local_1788.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_38);
                                                  local_2141 = false;
                                                  if (bVar2) {
                                                    local_2141 = wasm::Literal::isSignedMax
                                                                           (&local_1340->value);
                                                  }
                                                  BVar1.wasm = builder.wasm;
                                                  if (local_2141 == false) {
                                                    local_1818[0] =
                                                         Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&right,ppEVar13);
                                                  Match::ival(&local_1860,-1);
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                                            (&local_1808,(Match *)0x5,(Op)local_1818
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1860,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                                  *)s2);
                                                  matcher_39.data = local_1808.data;
                                                  matcher_39._12_4_ = local_1808._12_4_;
                                                  matcher_39.binder = local_1808.binder;
                                                  matcher_39.submatchers.curr =
                                                       local_1808.submatchers.curr;
                                                  matcher_39.submatchers.next.curr =
                                                       local_1808.submatchers.next.curr;
                                                  matcher_39.submatchers.next._8_8_ =
                                                       local_1808.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_39);
                                                  BVar1 = builder;
                                                  if (bVar2) {
                                                    local_1880 = local_40.id;
                                                    wasm::Literal::makeZero(&local_1878,local_40);
                                                    wasm::Literal::operator=
                                                              ((Literal *)(type.id + 0x10),
                                                               &local_1878);
                                                    wasm::Literal::~Literal(&local_1878);
                                                    x = (Expression *)local_40.id;
                                                    BVar7 = Abstract::getBinary(local_40,Sub);
                                                    *(BinaryOp *)
                                                     &((builder.wasm)->exports).
                                                                                                            
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = BVar7;
                                                  ((builder.wasm)->functions).
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)type.id;
                                                  ((builder.wasm)->functions).
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)right;
                                                  this_local = (OptimizeInstructions *)builder.wasm;
                                                  }
                                                  else {
                                                    ppEVar13 = (Expression **)0x1;
                                                    Match::ival((
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                                  *)(local_1938 + 0x10),1);
                                                  local_1938._0_8_ =
                                                       Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)local_1890,ppEVar13);
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                                                            (&local_18e0,(Match *)0xa,
                                                             (int)local_1938 + Or,
                                                             (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                                  *)local_1938,
                                                  (
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)s2);
                                                  Match::ival(&local_1980,-1);
                                                  ppEVar13 = (Expression **)0x11;
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                                                            (&local_18b8,(Match *)0x11,
                                                             (Op)&local_18e0,
                                                             (
                                                  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                                                  *)&local_1980,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                                                  *)s2);
                                                  matcher_40.data = local_18b8.data;
                                                  matcher_40._12_4_ = local_18b8._12_4_;
                                                  matcher_40.binder = local_18b8.binder;
                                                  matcher_40.submatchers.curr =
                                                       local_18b8.submatchers.curr;
                                                  matcher_40.submatchers.next.curr =
                                                       local_18b8.submatchers.next.curr;
                                                  matcher_40.submatchers.next._8_8_ =
                                                       local_18b8.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_40);
                                                  local_2161 = 0;
                                                  if (bVar2) {
                                                    pPVar12 = Pass::getPassOptions((Pass *)this);
                                                    local_2161 = pPVar12->targetJS ^ 0xff;
                                                  }
                                                  BVar1.wasm = builder.wasm;
                                                  if ((local_2161 & 1) == 0) {
                                                    local_19e8[0] =
                                                         Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)local_19b0,ppEVar13);
                                                  Match::fval(&local_1a30,2.0);
                                                  ppEVar13 = (Expression **)0x5;
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>>
                                                            (&local_19d8,(Match *)0x5,(Op)local_19e8
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1a30,s2);
                                                  matcher_41.data = local_19d8.data;
                                                  matcher_41._12_4_ = local_19d8._12_4_;
                                                  matcher_41.binder = local_19d8.binder;
                                                  matcher_41.submatchers.curr =
                                                       local_19d8.submatchers.curr;
                                                  matcher_41.submatchers.next.curr =
                                                       local_19d8.submatchers.next.curr;
                                                  matcher_41.submatchers.next._8_8_ =
                                                       local_19d8.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_41);
                                                  local_2179 = false;
                                                  if (bVar2) {
                                                    bVar2 = Expression::is<wasm::LocalGet>
                                                                      ((Expression *)local_19b0);
                                                    local_2189 = true;
                                                    if (!bVar2) {
                                                      local_2189 = Expression::is<wasm::GlobalGet>
                                                                             ((Expression *)
                                                                              local_19b0);
                                                    }
                                                    local_2179 = local_2189;
                                                  }
                                                  BVar1.wasm = builder.wasm;
                                                  if (local_2179 == false) {
                                                    local_2199 = false;
                                                    pOVar14 = this;
                                                    if ((this->fastMath & 1U) != 0) {
                                                      local_1a78[0] = Match::any();
                                                      Match::fval(&local_1ab8,&local_1a40);
                                                      ppEVar13 = (Expression **)0x3;
                                                      Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>>
                                                            (&local_1a68,(Match *)0x3,(Op)local_1a78
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1ab8,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
                                                  *)s2);
                                                  matcher_42.data = local_1a68.data;
                                                  matcher_42._12_4_ = local_1a68._12_4_;
                                                  matcher_42.binder = local_1a68.binder;
                                                  matcher_42.submatchers.curr =
                                                       local_1a68.submatchers.curr;
                                                  matcher_42.submatchers.next.curr =
                                                       local_1a68.submatchers.next.curr;
                                                  matcher_42.submatchers.next._8_8_ =
                                                       local_1a68.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_42);
                                                  pOVar14 = (OptimizeInstructions *)
                                                            CONCAT71(local_1a68.submatchers.next.
                                                                     _9_7_,bVar2);
                                                  local_2199 = false;
                                                  if (bVar2) {
                                                    local_2199 = false;
                                                    if ((local_1a40 == 0.0) && (!NAN(local_1a40))) {
                                                      local_2199 = std::signbit(local_1a40);
                                                    }
                                                  }
                                                  }
                                                  BVar1.wasm = builder.wasm;
                                                  if (local_2199 == false) {
                                                    local_1b10[0] =
                                                         Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&right,ppEVar13);
                                                  Match::
                                                  unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                                                            (&local_1b00,(Match *)0x1,(Op)local_1b10
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)pOVar14);
                                                  Match::fval();
                                                  ppEVar13 = (Expression **)0x5;
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>>
                                                            (&local_1ae0,(Match *)0x5,
                                                             (Op)&local_1b00,local_1b50,
                                                             (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
                                                  *)s2);
                                                  matcher_43.data = local_1ae0.data;
                                                  matcher_43._12_4_ = local_1ae0._12_4_;
                                                  matcher_43.binder = local_1ae0.binder;
                                                  matcher_43.submatchers.curr =
                                                       local_1ae0.submatchers.curr;
                                                  matcher_43.submatchers.next.curr =
                                                       local_1ae0.submatchers.next.curr;
                                                  matcher_43.submatchers.next._8_8_ =
                                                       local_1ae0.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_43);
                                                  BVar1 = builder;
                                                  s = (
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)CONCAT71(local_1ae0.submatchers.next._9_7_,bVar2
                                                            );
                                                  local_21a9 = true;
                                                  if (!bVar2) {
                                                    local_1ba8[0] =
                                                         Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&right,ppEVar13);
                                                  Match::
                                                  unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                                                            (&local_1b98,(Match *)0x1,(Op)local_1ba8
                                                             ,s);
                                                  Match::fval();
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>>
                                                            (&local_1b78,(Match *)0x7,
                                                             (Op)&local_1b98,local_1be8,
                                                             (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
                                                  *)s2);
                                                  matcher_44.data = local_1b78.data;
                                                  matcher_44._12_4_ = local_1b78._12_4_;
                                                  matcher_44.binder = local_1b78.binder;
                                                  matcher_44.submatchers.curr =
                                                       local_1b78.submatchers.curr;
                                                  matcher_44.submatchers.next.curr =
                                                       local_1b78.submatchers.next.curr;
                                                  matcher_44.submatchers.next._8_8_ =
                                                       local_1b78.submatchers.next._8_8_;
                                                  local_21a9 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_44);
                                                  }
                                                  BVar1.wasm = builder.wasm;
                                                  if (local_21a9 == false) {
                                                    local_1c38[0] = Match::any();
                                                    Match::fval(&local_1c80,-1.0);
                                                    ppEVar13 = (Expression **)0x5;
                                                    Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>>
                                                            (&local_1c28,(Match *)0x5,(Op)local_1c38
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1c80,s2);
                                                  matcher_45.data = local_1c28.data;
                                                  matcher_45._12_4_ = local_1c28._12_4_;
                                                  matcher_45.binder = local_1c28.binder;
                                                  matcher_45.submatchers.curr =
                                                       local_1c28.submatchers.curr;
                                                  matcher_45.submatchers.next.curr =
                                                       local_1c28.submatchers.next.curr;
                                                  matcher_45.submatchers.next._8_8_ =
                                                       local_1c28.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_45);
                                                  BVar1 = builder;
                                                  if (bVar2) {
                                                    if ((this->fastMath & 1U) == 0) {
                                                      local_1c90 = local_40.id;
                                                      BVar7 = Abstract::getBinary(local_40,Sub);
                                                      *(BinaryOp *)
                                                       &((builder.wasm)->exports).
                                                                                                                
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = BVar7;
                                                  local_1cc8 = local_40.id;
                                                  wasm::Literal::makeZero(&local_1cc0,local_40);
                                                  wasm::Literal::neg(&local_1ca8,&local_1cc0);
                                                  wasm::Literal::operator=
                                                            ((Literal *)(type.id + 0x10),&local_1ca8
                                                            );
                                                  wasm::Literal::~Literal(&local_1ca8);
                                                  wasm::Literal::~Literal(&local_1cc0);
                                                  std::swap<wasm::Expression*>
                                                            ((Expression **)
                                                             &(builder.wasm)->functions,
                                                             (Expression **)
                                                             &((builder.wasm)->functions).
                                                                                                                            
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                                  this_local = (OptimizeInstructions *)builder.wasm;
                                                  }
                                                  else {
                                                    local_1c88 = local_40.id;
                                                    UVar6 = Abstract::getUnary(local_40,Neg);
                                                    this_local = (OptimizeInstructions *)
                                                                 Builder::makeUnary((Builder *)&left
                                                                                    ,UVar6,(
                                                  Expression *)right);
                                                  }
                                                  }
                                                  else {
                                                    local_1d00[0] =
                                                         Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&right,ppEVar13);
                                                  Match::constant(&local_1d28,1);
                                                  ppEVar13 = (Expression **)0x5;
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>>
                                                            (&local_1cf0,(Match *)0x5,(Op)local_1d00
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1d28,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>
                                                  *)s2);
                                                  matcher_46.data = local_1cf0.data;
                                                  matcher_46._12_4_ = local_1cf0._12_4_;
                                                  matcher_46.binder = local_1cf0.binder;
                                                  matcher_46.submatchers.curr =
                                                       local_1cf0.submatchers.curr;
                                                  matcher_46.submatchers.next.curr =
                                                       local_1cf0.submatchers.next.curr;
                                                  matcher_46.submatchers.next._8_8_ =
                                                       local_1cf0.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_46);
                                                  BVar1 = builder;
                                                  local_21d9 = true;
                                                  if (!bVar2) {
                                                    local_1d60[0] =
                                                         Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&right,ppEVar13);
                                                  Match::constant(&local_1d88,1);
                                                  ppEVar13 = (Expression **)0x7;
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>>
                                                            (&local_1d50,(Match *)0x7,(Op)local_1d60
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&local_1d88,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>
                                                  *)s2);
                                                  matcher_47.data = local_1d50.data;
                                                  matcher_47._12_4_ = local_1d50._12_4_;
                                                  matcher_47.binder = local_1d50.binder;
                                                  matcher_47.submatchers.curr =
                                                       local_1d50.submatchers.curr;
                                                  matcher_47.submatchers.next.curr =
                                                       local_1d50.submatchers.next.curr;
                                                  matcher_47.submatchers.next._8_8_ =
                                                       local_1d50.submatchers.next._8_8_;
                                                  bVar2 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_47);
                                                  BVar1 = builder;
                                                  local_21d9 = true;
                                                  if (!bVar2) {
                                                    local_1dc0[0] =
                                                         Match::any((
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&right,ppEVar13);
                                                  Match::constant((
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>
                                                  *)&c_2,1);
                                                  Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>>
                                                            (&local_1db0,(Match *)0x6,(Op)local_1dc0
                                                             ,(
                                                  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>
                                                  *)&c_2,(
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>_>
                                                  *)s2);
                                                  matcher_48.data = local_1db0.data;
                                                  matcher_48._12_4_ = local_1db0._12_4_;
                                                  matcher_48.binder = local_1db0.binder;
                                                  matcher_48.submatchers.curr =
                                                       local_1db0.submatchers.curr;
                                                  matcher_48.submatchers.next.curr =
                                                       local_1db0.submatchers.next.curr;
                                                  matcher_48.submatchers.next._8_8_ =
                                                       local_1db0.submatchers.next._8_8_;
                                                  local_21d9 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::NumberLitKind>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_48);
                                                  }
                                                  }
                                                  if ((local_21d9 == false) ||
                                                     ((bVar2 = wasm::Type::isInteger
                                                                         ((Type *)&((builder.wasm)->
                                                                                   exports).
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish),
                                                  !bVar2 && ((this->fastMath & 1U) == 0)))) {
                                                    BVar1.wasm = builder.wasm;
                                                    pure(&local_1e50,this,&local_1e00);
                                                    Match::fval(&local_1e90,(Const **)&bin);
                                                    Match::
                                                  binary<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>>
                                                            (&local_1e38,(Match *)&x_2,
                                                             (Binary **)&local_1e50,
                                                             (
                                                  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>
                                                  *)&local_1e90,
                                                  (
                                                  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
                                                  *)s2);
                                                  matcher_49._8_8_ = local_1e38._8_8_;
                                                  matcher_49.binder = local_1e38.binder;
                                                  matcher_49.submatchers.curr.binder =
                                                       local_1e38.submatchers.curr.binder;
                                                  matcher_49.submatchers.curr._8_8_ =
                                                       local_1e38.submatchers.curr._8_8_;
                                                  matcher_49.submatchers.next.curr =
                                                       local_1e38.submatchers.next.curr;
                                                  matcher_49.submatchers.next.next.curr =
                                                       local_1e38.submatchers.next.next.curr;
                                                  matcher_49.submatchers.next.next._8_8_ =
                                                       local_1e38.submatchers.next.next._8_8_;
                                                  bVar3 = Match::
                                                  matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&>>
                                                            ((Expression *)BVar1.wasm,matcher_49);
                                                  bVar2 = false;
                                                  if (bVar3) {
                                                    __value = wasm::Literal::getFloat
                                                                        ((Literal *)&bin->op);
                                                    uVar8 = std::isnan(__value);
                                                    bVar2 = false;
                                                    if ((uVar8 & 1) != 0) {
                                                      BVar7 = *(BinaryOp *)(x_2 + 1);
                                                      local_1e98 = (local_1e00->type).id;
                                                      BVar9 = Abstract::getBinary((Type)local_1e98,
                                                                                  CopySign);
                                                      bVar2 = BVar7 != BVar9;
                                                    }
                                                  }
                                                  if (bVar2) {
                                                    bVar2 = Binary::isRelational((Binary *)x_2);
                                                    if (bVar2) {
                                                      wasm::Type::Type(&local_1ea0,i32);
                                                      (bin->
                                                  super_SpecificExpression<(wasm::Expression::Id)16>
                                                  ).super_Expression.type.id = local_1ea0.id;
                                                  BVar7 = *(BinaryOp *)(x_2 + 1);
                                                  local_1ea8 = (local_1e00->type).id;
                                                  BVar9 = Abstract::getBinary((Type)local_1ea8,Ne);
                                                  if (BVar7 == BVar9) {
                                                    wasm::Type::Type(&local_1ec8,i32);
                                                    wasm::Literal::makeOne(&local_1ec0,local_1ec8);
                                                    wasm::Literal::operator=
                                                              ((Literal *)&bin->op,&local_1ec0);
                                                    wasm::Literal::~Literal(&local_1ec0);
                                                  }
                                                  else {
                                                    wasm::Type::Type(&local_1ee8,i32);
                                                    wasm::Literal::makeZero(&local_1ee0,local_1ee8);
                                                    wasm::Literal::operator=
                                                              ((Literal *)&bin->op,&local_1ee0);
                                                    wasm::Literal::~Literal(&local_1ee0);
                                                  }
                                                  this_local = (OptimizeInstructions *)bin;
                                                  }
                                                  else {
                                                    wasm::Literal::standardizeNaN
                                                              (&local_1f00,(Literal *)&bin->op);
                                                    wasm::Literal::operator=
                                                              ((Literal *)&bin->op,&local_1f00);
                                                    wasm::Literal::~Literal(&local_1f00);
                                                    this_local = (OptimizeInstructions *)bin;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (OptimizeInstructions *)0x0;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (OptimizeInstructions *)right;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    wasm::Literal::neg(&local_1c00,
                                                                       (Literal *)(type.id + 0x10));
                                                    wasm::Literal::operator=
                                                              ((Literal *)(type.id + 0x10),
                                                               &local_1c00);
                                                    wasm::Literal::~Literal(&local_1c00);
                                                    ((builder.wasm)->functions).
                                                                                                        
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)right;
                                                  this_local = (OptimizeInstructions *)builder.wasm;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (OptimizeInstructions *)
                                                                 ((builder.wasm)->functions).
                                                                                                                                  
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  }
                                                  }
                                                  else {
                                                    value = (double)local_40.id;
                                                    BVar7 = Abstract::getBinary(local_40,Add);
                                                    *(BinaryOp *)
                                                     &((builder.wasm)->exports).
                                                                                                            
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = BVar7;
                                                  pMVar10 = 
                                                  Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                                  ::getModule(&(this->
                                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                                  ).
                                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                                  .
                                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                                  );
                                                  iVar5 = ExpressionManipulator::copy
                                                                    ((EVP_PKEY_CTX *)local_19b0,
                                                                     (EVP_PKEY_CTX *)pMVar10);
                                                  ((builder.wasm)->functions).
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)CONCAT44(extraout_var,iVar5);
                                                  this_local = (OptimizeInstructions *)builder.wasm;
                                                  }
                                                  }
                                                  else {
                                                    local_1988 = local_40.id;
                                                    BVar7 = Abstract::getBinary(local_40,RotL);
                                                    *(BinaryOp *)
                                                     &((builder.wasm)->exports).
                                                                                                            
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = BVar7;
                                                  x_1 = (Expression *)local_40.id;
                                                  wasm::Literal::makeFromInt32
                                                            (&local_19a0,-2,local_40);
                                                  wasm::Literal::operator=
                                                            ((Literal *)(type.id + 0x10),&local_19a0
                                                            );
                                                  wasm::Literal::~Literal(&local_19a0);
                                                  ((builder.wasm)->functions).
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)type.id;
                                                  ((builder.wasm)->functions).
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)local_1890;
                                                  this_local = (OptimizeInstructions *)builder.wasm;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_17e0 = local_40.id;
                                                    BVar7 = Abstract::getBinary(local_40,Eq);
                                                    *(BinaryOp *)
                                                     &((builder.wasm)->exports).
                                                                                                            
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = BVar7;
                                                  this_local = (OptimizeInstructions *)builder.wasm;
                                                  }
                                                }
                                                else {
                                                  local_1760 = local_40.id;
                                                  BVar7 = Abstract::getBinary(local_40,Ne);
                                                  *(BinaryOp *)
                                                   &((builder.wasm)->exports).
                                                                                                        
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = BVar7;
                                                  this_local = (OptimizeInstructions *)builder.wasm;
                                                }
                                              }
                                              else {
                                                local_16e0 = local_40.id;
                                                BVar7 = Abstract::getBinary(local_40,Eq);
                                                *(BinaryOp *)
                                                 &((builder.wasm)->exports).
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                     = BVar7;
                                                this_local = (OptimizeInstructions *)builder.wasm;
                                              }
                                            }
                                            else {
                                              local_1660 = local_40.id;
                                              BVar7 = Abstract::getBinary(local_40,Ne);
                                              *(BinaryOp *)
                                               &((builder.wasm)->exports).
                                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   BVar7;
                                              this_local = (OptimizeInstructions *)builder.wasm;
                                            }
                                          }
                                          else {
                                            wasm::Type::Type(&local_15d8,i32);
                                            wasm::Literal::makeOne(&local_15d0,local_15d8);
                                            wasm::Literal::operator=
                                                      ((Literal *)(type.id + 0x10),&local_15d0);
                                            wasm::Literal::~Literal(&local_15d0);
                                            wasm::Type::Type(&local_15e0,i32);
                                            *(uintptr_t *)(type.id + 8) = local_15e0.id;
                                            this_local = (OptimizeInstructions *)type.id;
                                          }
                                        }
                                        else {
                                          wasm::Type::Type(&local_1530,i32);
                                          wasm::Literal::makeZero(&local_1528,local_1530);
                                          wasm::Literal::operator=
                                                    ((Literal *)(type.id + 0x10),&local_1528);
                                          wasm::Literal::~Literal(&local_1528);
                                          wasm::Type::Type(&local_1538,i32);
                                          *(uintptr_t *)(type.id + 8) = local_1538.id;
                                          this_local = (OptimizeInstructions *)type.id;
                                        }
                                      }
                                      else {
                                        wasm::Type::Type(&local_1488,i32);
                                        wasm::Literal::makeOne(&local_1480,local_1488);
                                        wasm::Literal::operator=
                                                  ((Literal *)(type.id + 0x10),&local_1480);
                                        wasm::Literal::~Literal(&local_1480);
                                        wasm::Type::Type(&local_1490,i32);
                                        *(uintptr_t *)(type.id + 8) = local_1490.id;
                                        this_local = (OptimizeInstructions *)type.id;
                                      }
                                    }
                                    else {
                                      wasm::Type::Type(&local_13e0,i32);
                                      wasm::Literal::makeZero(&local_13d8,local_13e0);
                                      wasm::Literal::operator=
                                                ((Literal *)(type.id + 0x10),&local_13d8);
                                      wasm::Literal::~Literal(&local_13d8);
                                      wasm::Type::Type(&local_13e8,i32);
                                      *(uintptr_t *)(type.id + 8) = local_13e8.id;
                                      this_local = (OptimizeInstructions *)type.id;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    *(undefined4 *)
                     &((builder.wasm)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = 0x28;
                    wasm::Type::Type(&local_e68,i32);
                    ((builder.wasm)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e68.id;
                    this_local = (OptimizeInstructions *)
                                 Builder::makeUnary((Builder *)&left,ExtendUInt32,
                                                    (Expression *)builder.wasm);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

Expression* optimizeWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    Expression* left;
    auto* right = curr->right->cast<Const>();
    auto type = curr->right->type;

    // Operations on zero
    if (matches(curr, binary(Shl, any(&left), ival(0))) ||
        matches(curr, binary(ShrU, any(&left), ival(0))) ||
        matches(curr, binary(ShrS, any(&left), ival(0))) ||
        matches(curr, binary(Or, any(&left), ival(0))) ||
        matches(curr, binary(Xor, any(&left), ival(0)))) {
      return left;
    }
    if (matches(curr, binary(Mul, pure(&left), ival(0))) ||
        matches(curr, binary(And, pure(&left), ival(0)))) {
      return right;
    }
    // -x * C   ==>    x * -C,   if  shrinkLevel != 0  or  C != C_pot
    // -x * C   ==>   -(x * C),  otherwise
    //    where  x, C  are integers
    Binary* inner;
    if (matches(
          curr,
          binary(Mul, binary(&inner, Sub, ival(0), any(&left)), ival()))) {
      if (getPassOptions().shrinkLevel != 0 ||
          !Bits::isPowerOf2(right->value.getInteger())) {
        right->value = right->value.neg();
        curr->left = left;
        return curr;
      } else {
        curr->left = left;
        Const* zero = inner->left->cast<Const>();
        return builder.makeBinary(inner->op, zero, curr);
      }
    }
    // x == 0   ==>   eqz x
    if (matches(curr, binary(Eq, any(&left), ival(0)))) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // Operations on one
    // (signed)x % 1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // (signed)x % C_pot != 0   ==>  (x & (abs(C_pot) - 1)) != 0
    {
      Const* c;
      Binary* inner;
      if (matches(curr,
                  binary(Ne, binary(&inner, RemS, any(), ival(&c)), ival(0))) &&
          (c->value.isSignedMin() ||
           Bits::isPowerOf2(c->value.abs().getInteger()))) {
        inner->op = Abstract::getBinary(c->type, And);
        if (c->value.isSignedMin()) {
          c->value = Literal::makeSignedMax(c->type);
        } else {
          c->value = c->value.abs().sub(Literal::makeOne(c->type));
        }
        return curr;
      }
    }
    // i32(bool(x)) == 1  ==>  i32(bool(x))
    // i32(bool(x)) != 0  ==>  i32(bool(x))
    // i32(bool(x)) & 1   ==>  i32(bool(x))
    // i64(bool(x)) & 1   ==>  i64(bool(x))
    if ((matches(curr, binary(EqInt32, any(&left), i32(1))) ||
         matches(curr, binary(NeInt32, any(&left), i32(0))) ||
         matches(curr, binary(And, any(&left), ival(1)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return left;
    }
    // i64(bool(x)) == 1  ==>  i32(bool(x))
    // i64(bool(x)) != 0  ==>  i32(bool(x))
    if ((matches(curr, binary(EqInt64, any(&left), i64(1))) ||
         matches(curr, binary(NeInt64, any(&left), i64(0)))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(WrapInt64, left);
    }
    // bool(x) != 1  ==>  !bool(x)
    if (matches(curr, binary(Ne, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return builder.makeUnary(Abstract::getUnary(type, EqZ), left);
    }
    // bool(x)  ^ 1  ==>  !bool(x)
    if (matches(curr, binary(Xor, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      auto* result = builder.makeUnary(Abstract::getUnary(type, EqZ), left);
      if (left->type == Type::i64) {
        // Xor's result is also an i64 in this case, but EqZ returns i32, so we
        // must expand it so that we keep returning the same value as before.
        // This means we replace a xor and a const with a xor and an extend,
        // which is still smaller (the const is 2 bytes, the extend just 1), and
        // also the extend may be removed by further work.
        result = builder.makeUnary(ExtendUInt32, result);
      }
      return result;
    }
    // bool(x) | 1  ==>  1
    if (matches(curr, binary(Or, any(&left), ival(1))) &&
        Bits::getMaxBits(left, this) == 1) {
      return getDroppedChildrenAndAppend(curr, right);
    }

    // Operations on all 1s
    // x & -1   ==>   x
    if (matches(curr, binary(And, any(&left), ival(-1)))) {
      return left;
    }
    // x | -1   ==>   -1
    if (matches(curr, binary(Or, any(&left), ival(-1)))) {
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (signed)x % -1   ==>   0
    if (matches(curr, binary(RemS, pure(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      return right;
    }
    // i32(x) / i32.min_s   ==>   x == i32.min_s
    if (matches(
          curr,
          binary(DivSInt32, any(), i32(std::numeric_limits<int32_t>::min())))) {
      curr->op = EqInt32;
      return curr;
    }
    // i64(x) / i64.min_s   ==>   i64(x == i64.min_s)
    // only for zero shrink level
    if (getPassOptions().shrinkLevel == 0 &&
        matches(
          curr,
          binary(DivSInt64, any(), i64(std::numeric_limits<int64_t>::min())))) {
      curr->op = EqInt64;
      curr->type = Type::i32;
      return builder.makeUnary(ExtendUInt32, curr);
    }
    // (unsigned)x < 0   ==>   i32(0)
    if (matches(curr, binary(LtU, pure(&left), ival(0)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x <= -1  ==>   i32(1)
    if (matches(curr, binary(LeU, any(&left), ival(-1)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x > -1   ==>   i32(0)
    if (matches(curr, binary(GtU, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(Type::i32);
      right->type = Type::i32;
      return getDroppedChildrenAndAppend(curr, right);
    }
    // (unsigned)x >= 0   ==>   i32(1)
    if (matches(curr, binary(GeU, pure(&left), ival(0)))) {
      right->value = Literal::makeOne(Type::i32);
      right->type = Type::i32;
      return right;
    }
    // (unsigned)x < -1   ==>   x != -1
    // Friendlier to JS emitting as we don't need to write an unsigned -1 value
    // which is large.
    if (matches(curr, binary(LtU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x <= 0   ==>   x == 0
    if (matches(curr, binary(LeU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    // (unsigned)x > 0   ==>   x != 0
    if (matches(curr, binary(GtU, any(), ival(0)))) {
      curr->op = Abstract::getBinary(type, Ne);
      return curr;
    }
    // (unsigned)x >= -1  ==>   x == -1
    if (matches(curr, binary(GeU, any(), ival(-1)))) {
      curr->op = Abstract::getBinary(type, Eq);
      return curr;
    }
    {
      Const* c;
      // (signed)x < (i32|i64).min_s   ==>   i32(0)
      if (matches(curr, binary(LtS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x <= (i32|i64).max_s   ==>   i32(1)
      if (matches(curr, binary(LeS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x > (i32|i64).max_s   ==>   i32(0)
      if (matches(curr, binary(GtS, pure(&left), ival(&c))) &&
          c->value.isSignedMax()) {
        right->value = Literal::makeZero(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x >= (i32|i64).min_s   ==>   i32(1)
      if (matches(curr, binary(GeS, pure(&left), ival(&c))) &&
          c->value.isSignedMin()) {
        right->value = Literal::makeOne(Type::i32);
        right->type = Type::i32;
        return right;
      }
      // (signed)x < (i32|i64).max_s   ==>   x != (i32|i64).max_s
      if (matches(curr, binary(LtS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x <= (i32|i64).min_s   ==>   x == (i32|i64).min_s
      if (matches(curr, binary(LeS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
      // (signed)x > (i32|i64).min_s   ==>   x != (i32|i64).min_s
      if (matches(curr, binary(GtS, any(), ival(&c))) &&
          c->value.isSignedMin()) {
        curr->op = Abstract::getBinary(type, Ne);
        return curr;
      }
      // (signed)x >= (i32|i64).max_s   ==>   x == (i32|i64).max_s
      if (matches(curr, binary(GeS, any(), ival(&c))) &&
          c->value.isSignedMax()) {
        curr->op = Abstract::getBinary(type, Eq);
        return curr;
      }
    }
    // x * -1   ==>   0 - x
    if (matches(curr, binary(Mul, any(&left), ival(-1)))) {
      right->value = Literal::makeZero(type);
      curr->op = Abstract::getBinary(type, Sub);
      curr->left = right;
      curr->right = left;
      return curr;
    }
    {
      // ~(1 << x) aka (1 << x) ^ -1  ==>  rotl(-2, x)
      Expression* x;
      // Note that we avoid this in JS mode, as emitting a rotation would
      // require lowering that rotation for JS in another cycle of work.
      if (matches(curr, binary(Xor, binary(Shl, ival(1), any(&x)), ival(-1))) &&
          !getPassOptions().targetJS) {
        curr->op = Abstract::getBinary(type, RotL);
        right->value = Literal::makeFromInt32(-2, type);
        curr->left = right;
        curr->right = x;
        return curr;
      }
    }
    {
      // x * 2.0  ==>  x + x
      // but we apply this only for simple expressions like
      // local.get and global.get for avoid using extra local
      // variable.
      Expression* x;
      if (matches(curr, binary(Mul, any(&x), fval(2.0))) &&
          (x->is<LocalGet>() || x->is<GlobalGet>())) {
        curr->op = Abstract::getBinary(type, Abstract::Add);
        curr->right = ExpressionManipulator::copy(x, *getModule());
        return curr;
      }
    }
    {
      // x + (-0.0)   ==>   x
      double value;
      if (fastMath && matches(curr, binary(Add, any(), fval(&value))) &&
          value == 0.0 && std::signbit(value)) {
        return curr->left;
      }
    }
    // -x * fval(C)   ==>   x * -C
    // -x / fval(C)   ==>   x / -C
    if (matches(curr, binary(Mul, unary(Neg, any(&left)), fval())) ||
        matches(curr, binary(DivS, unary(Neg, any(&left)), fval()))) {
      right->value = right->value.neg();
      curr->left = left;
      return curr;
    }
    // x * -1.0   ==>
    //       -x,  if fastMath == true
    // -0.0 - x,  if fastMath == false
    if (matches(curr, binary(Mul, any(), fval(-1.0)))) {
      if (fastMath) {
        return builder.makeUnary(Abstract::getUnary(type, Neg), left);
      }
      // x * -1.0   ==>  -0.0 - x
      curr->op = Abstract::getBinary(type, Sub);
      right->value = Literal::makeZero(type).neg();
      std::swap(curr->left, curr->right);
      return curr;
    }
    if (matches(curr, binary(Mul, any(&left), constant(1))) ||
        matches(curr, binary(DivS, any(&left), constant(1))) ||
        matches(curr, binary(DivU, any(&left), constant(1)))) {
      if (curr->type.isInteger() || fastMath) {
        return left;
      }
    }
    {
      //   x !=  NaN   ==>   1
      //   x <=> NaN   ==>   0
      //   x op  NaN'  ==>   NaN',  iff `op` != `copysign` and `x` != C
      Const* c;
      Binary* bin;
      Expression* x;
      if (matches(curr, binary(&bin, pure(&x), fval(&c))) &&
          std::isnan(c->value.getFloat()) &&
          bin->op != getBinary(x->type, CopySign)) {
        if (bin->isRelational()) {
          // reuse "c" (nan) constant
          c->type = Type::i32;
          if (bin->op == getBinary(x->type, Ne)) {
            // x != NaN  ==>  1
            c->value = Literal::makeOne(Type::i32);
          } else {
            // x == NaN,
            // x >  NaN,
            // x <= NaN
            // x .. NaN  ==>  0
            c->value = Literal::makeZero(Type::i32);
          }
          return c;
        }
        // propagate NaN of RHS but canonicalize it
        c->value = Literal::standardizeNaN(c->value);
        return c;
      }
    }
    return nullptr;
  }